

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

DdGen * Cudd_zddFirstPath(DdManager *zdd,DdNode *f,int **path)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int iVar4;
  DdGen *__ptr;
  int *__ptr_00;
  ulong uVar5;
  DdNode **__s;
  long lVar6;
  long lVar7;
  DdNode *pDVar8;
  uint *puVar9;
  
  if (f != (DdNode *)0x0 && zdd != (DdManager *)0x0) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr == (DdGen *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr->manager = zdd;
      __ptr->type = 3;
      *(undefined8 *)&__ptr->status = 0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.cube + 4) = 0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.value + 4) = 0;
      (__ptr->stack).stack = (DdNode **)0x0;
      __ptr->node = (DdNode *)0x0;
      uVar1 = zdd->sizeZ;
      __ptr_00 = (int *)malloc((long)(int)uVar1 * 4);
      (__ptr->gen).cubes.cube = __ptr_00;
      if (__ptr_00 == (int *)0x0) {
        zdd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            __ptr_00[uVar5] = 2;
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        __s = (DdNode **)malloc((long)(int)uVar1 * 8 + 8);
        (__ptr->stack).stack = __s;
        if (__s != (DdNode **)0x0) {
          if (-1 < (int)uVar1) {
            memset(__s,0,(ulong)uVar1 * 8 + 8);
          }
          iVar4 = (__ptr->stack).sp;
          __s[iVar4] = f;
          iVar4 = iVar4 + 1;
          (__ptr->stack).sp = iVar4;
          while( true ) {
            while( true ) {
              lVar6 = (long)iVar4;
              pDVar8 = (DdNode *)((ulong)__s[lVar6 + -1] & 0xfffffffffffffffe);
              if ((ulong)pDVar8->index == 0x7fffffff) break;
              (__ptr->gen).cubes.cube[pDVar8->index] = 0;
              __s[lVar6] = (DdNode *)((ulong)(pDVar8->type).kids.E ^ 1);
              iVar4 = iVar4 + 1;
            }
            if (zdd->zero != pDVar8) break;
            if (iVar4 == 1) goto LAB_007a890c;
            lVar7 = lVar6 + -1;
            pDVar8 = __s[lVar6 + -1];
            while( true ) {
              pDVar2 = __s[lVar7 + -1];
              puVar9 = (uint *)((ulong)pDVar2 & 0xfffffffffffffffe);
              pDVar3 = *(DdNode **)(puVar9 + 4);
              if (pDVar3 != pDVar8) break;
              (__ptr->gen).cubes.cube[*puVar9] = 2;
              iVar4 = iVar4 + -1;
              lVar7 = lVar7 + -1;
              pDVar8 = pDVar2;
              if (lVar7 == 0) {
                iVar4 = 1;
                goto LAB_007a890c;
              }
            }
            (__ptr->gen).cubes.cube[*puVar9] = 1;
            __s[lVar7] = pDVar3;
          }
          (__ptr->stack).sp = iVar4;
          __ptr->status = 1;
          (__ptr->gen).cubes.value = (pDVar8->type).value;
          goto LAB_007a8918;
        }
        zdd->errorCode = CUDD_MEMORY_OUT;
        free(__ptr_00);
        (__ptr->gen).cubes.cube = (int *)0x0;
      }
      free(__ptr);
    }
  }
  return (DdGen *)0x0;
LAB_007a890c:
  __ptr->status = 0;
  (__ptr->stack).sp = iVar4 + -1;
LAB_007a8918:
  *path = (__ptr->gen).cubes.cube;
  return __ptr;
}

Assistant:

DdGen *
Cudd_zddFirstPath(
  DdManager * zdd,
  DdNode * f,
  int ** path)
{
    DdGen *gen;
    DdNode *top, *next, *prev;
    int i;
    int nvars;

    /* Sanity Check. */
    if (zdd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = zdd;
    gen->type = CUDD_GEN_ZDD_PATHS;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = zdd->sizeZ;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first path of the ZDD. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    *path = gen->gen.cubes.cube;
    return(gen);

}